

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

CHAR_DATA * get_char_room(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *rch;
  int number;
  int count;
  char arg [4608];
  CHAR_DATA *ch_00;
  uint in_stack_ffffffffffffede0;
  int iVar3;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  CHAR_DATA *local_8;
  
  iVar3 = 0;
  iVar2 = number_argument((char *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                          (char *)(ulong)in_stack_ffffffffffffede0);
  bVar1 = str_cmp(&stack0xffffffffffffede8,"self");
  local_8 = in_RDI;
  if (bVar1) {
    for (ch_00 = in_RDI->in_room->people; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next_in_room) {
      if (*in_RSI == '\0') {
        return (CHAR_DATA *)0x0;
      }
      bVar1 = can_see(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      if (((bVar1) &&
          (((in_stack_ffffffffffffede8 == '\0' ||
            (bVar1 = is_name((char *)arg._4568_8_,(char *)arg._4560_8_), bVar1)) ||
           ((bVar1 = is_immortal(ch_00), bVar1 &&
            ((ch_00->true_name != (char *)0x0 &&
             (bVar1 = is_name((char *)arg._4568_8_,(char *)arg._4560_8_), bVar1)))))))) &&
         (iVar3 = iVar3 + 1, iVar3 == iVar2)) {
        return ch_00;
      }
    }
    local_8 = (CHAR_DATA *)0x0;
  }
  return local_8;
}

Assistant:

CHAR_DATA *get_char_room(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	auto count = 0;
	auto number = number_argument(argument, arg);

	if (!str_cmp(arg, "self"))
		return ch;

	for (auto rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (argument[0] == '\0')
			return nullptr;

		if (!can_see(ch, rch))
			continue;

		if (arg[0] != '\0'
			&& !is_name(arg, rch->name)
			&& (!is_immortal(ch) || !rch->true_name || !is_name(arg, rch->true_name)))
			continue;

		if (++count == number)
			return rch;
	}

	return nullptr;
}